

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int archive_read_support_format_iso9660(archive *_a)

{
  int iVar1;
  undefined4 *__ptr;
  archive *in_RDI;
  _func_int64_t_archive_read_ptr_int64_t_int *unaff_retaddr;
  _func_int_archive_read_ptr *in_stack_00000008;
  _func_int_archive_read_ptr *in_stack_00000010;
  _func_int_archive_read_ptr *in_stack_00000018;
  int magic_test;
  int r;
  iso9660 *iso9660;
  archive_read *a;
  uint in_stack_00000050;
  uint in_stack_00000054;
  archive *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffdc;
  archive *read_data;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  read_data = in_RDI;
  iVar1 = __archive_check_magic(in_stack_00000058,in_stack_00000054,in_stack_00000050,(char *)_a);
  if (iVar1 == -0x1e) {
    iVar1 = -0x1e;
  }
  else {
    __ptr = (undefined4 *)calloc(1,0xa10);
    if (__ptr == (undefined4 *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate iso9660 data");
      iVar1 = -0x1e;
    }
    else {
      *__ptr = 0x96609660;
      *(undefined8 *)(__ptr + 0x20) = 0;
      *(undefined4 **)(__ptr + 0x22) = __ptr + 0x20;
      *(undefined8 *)(__ptr + 0x24) = 0;
      *(undefined4 **)(__ptr + 0x26) = __ptr + 0x24;
      __ptr[1] = 1;
      __ptr[2] = 1;
      iVar1 = __archive_read_register_format
                        ((archive_read *)CONCAT44(in_stack_ffffffffffffffdc,iVar1),(void *)0x0,
                         (char *)0x0,archive_read_format_iso9660_cleanup,
                         (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,
                         archive_read_format_iso9660_read_data_skip,
                         (_func_int_archive_read_ptr_void_ptr_ptr_size_t_ptr_int64_t_ptr *)read_data
                         ,(_func_int_archive_read_ptr *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        free(__ptr);
      }
    }
  }
  return iVar1;
}

Assistant:

int
archive_read_support_format_iso9660(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct iso9660 *iso9660;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_iso9660");

	iso9660 = (struct iso9660 *)calloc(1, sizeof(*iso9660));
	if (iso9660 == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate iso9660 data");
		return (ARCHIVE_FATAL);
	}
	iso9660->magic = ISO9660_MAGIC;
	iso9660->cache_files.first = NULL;
	iso9660->cache_files.last = &(iso9660->cache_files.first);
	iso9660->re_files.first = NULL;
	iso9660->re_files.last = &(iso9660->re_files.first);
	/* Enable to support Joliet extensions by default.	*/
	iso9660->opt_support_joliet = 1;
	/* Enable to support Rock Ridge extensions by default.	*/
	iso9660->opt_support_rockridge = 1;

	r = __archive_read_register_format(a,
	    iso9660,
	    "iso9660",
	    archive_read_format_iso9660_bid,
	    archive_read_format_iso9660_options,
	    archive_read_format_iso9660_read_header,
	    archive_read_format_iso9660_read_data,
	    archive_read_format_iso9660_read_data_skip,
	    NULL,
	    archive_read_format_iso9660_cleanup,
	    NULL,
	    NULL);

	if (r != ARCHIVE_OK) {
		free(iso9660);
		return (r);
	}
	return (ARCHIVE_OK);
}